

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O1

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_strip
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A)

{
  pointer p_Var1;
  iterator __position;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  __int128 *__args;
  long lVar6;
  
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)p_Var1) >> 4;
  uVar5 = uVar4 & 0xffffffff;
  uVar3 = (int)uVar4 + 1;
  do {
    uVar5 = uVar5 - 1;
    if ((int)(uint)uVar5 < 0) {
      return __return_storage_ptr__;
    }
    uVar4 = (ulong)((uint)uVar5 & 0x7fffffff);
    uVar3 = uVar3 - 1;
  } while ((long)p_Var1[uVar4] == 0 && *(long *)((long)p_Var1 + uVar4 * 0x10 + 8) == 0);
  uVar4 = (ulong)uVar3;
  lVar6 = 0;
  do {
    __args = (__int128 *)
             ((long)(A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar6);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<__int128,std::allocator<__int128>>::_M_realloc_insert<__int128_const&>
                ((vector<__int128,std::allocator<__int128>> *)__return_storage_ptr__,__position,
                 __args);
    }
    else {
      uVar2 = *(undefined8 *)((long)__args + 8);
      *(long *)__position._M_current = (long)*__args;
      *(undefined8 *)((long)__position._M_current + 8) = uVar2;
      (__return_storage_ptr__->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    lVar6 = lVar6 + 0x10;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  return __return_storage_ptr__;
}

Assistant:

vector<ll128> reed_solomn::poly_strip(vector<ll128> A) {
    vector<ll128> res;
    for (int i = A.size()-1; i >=0 ; --i) {
        if (A[i] !=0) {
            for (int j = 0; j <= i; ++j) {
                res.push_back(A[j]);
            }
            break;
        }
    }
    return res;
}